

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall
TPZMatrix<TPZFlopCounter>::Diagonal(TPZMatrix<TPZFlopCounter> *this,TPZFlopCounter val)

{
  REAL *pRVar1;
  long lVar2;
  long lVar3;
  REAL local_38;
  REAL local_30;
  
  local_30 = val.fVal;
  if ((this->super_TPZBaseMatrix).fCol != (this->super_TPZBaseMatrix).fRow) {
    Error("Diagonal (TPZMatrix<>*) <TPZMatrix<>must be square>",(char *)0x0);
  }
  if (0 < (this->super_TPZBaseMatrix).fRow) {
    lVar2 = 0;
    do {
      if (0 < (this->super_TPZBaseMatrix).fCol) {
        lVar3 = 0;
        do {
          pRVar1 = &local_30;
          if (lVar2 != lVar3) {
            local_38 = 0.0;
            pRVar1 = &local_38;
          }
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,lVar2,lVar3,pRVar1);
          lVar3 = lVar3 + 1;
        } while (lVar3 < (this->super_TPZBaseMatrix).fCol);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < (this->super_TPZBaseMatrix).fRow);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Diagonal(TVar val) {
    
    if ( Cols() != Rows() ) {
        Error( "Diagonal (TPZMatrix<>*) <TPZMatrix<>must be square>" );
    }
    for ( int64_t row = 0; row < Rows(); row++) {
        for ( int64_t col = 0; col < Cols(); col++ ) {
            (row == col)? PutVal(row,col,val):PutVal(row,col,0.);
        }
    }
}